

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

void fasttext::utils::initSigmoid(void)

{
  int iVar1;
  double dVar2;
  real x;
  int i;
  
  if (t_sigmoid == (void *)0x0) {
    t_sigmoid = operator_new__(0x804);
    for (iVar1 = 0; iVar1 < 0x201; iVar1 = iVar1 + 1) {
      dVar2 = std::exp((double)(ulong)(uint)-((float)(iVar1 << 4) / 512.0 - 8.0));
      *(float *)((long)t_sigmoid + (long)iVar1 * 4) = 1.0 / (SUB84(dVar2,0) + 1.0);
    }
  }
  return;
}

Assistant:

void initSigmoid() {
    if (t_sigmoid != nullptr) return;
    t_sigmoid = new real[SIGMOID_TABLE_SIZE + 1];
    for (int i = 0; i < SIGMOID_TABLE_SIZE + 1; i++) {
      real x = real(i * 2 * MAX_SIGMOID) / SIGMOID_TABLE_SIZE - MAX_SIGMOID;
      t_sigmoid[i] = 1.0 / (1.0 + std::exp(-x));
    }
  }